

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_http_upstream_ip_hash_module.c
# Opt level: O3

ngx_int_t ngx_http_upstream_init_ip_hash_peer
                    (ngx_http_request_t *r,ngx_http_upstream_srv_conf_t *us)

{
  sockaddr *psVar1;
  void *pvVar2;
  ngx_int_t nVar3;
  u_char *puVar4;
  undefined1 uVar5;
  ngx_int_t nVar6;
  
  pvVar2 = ngx_palloc(r->pool,0x50);
  nVar6 = -1;
  if (pvVar2 != (void *)0x0) {
    (r->upstream->peer).data = pvVar2;
    nVar3 = ngx_http_upstream_init_round_robin_peer(r,us);
    if (nVar3 == 0) {
      (r->upstream->peer).get = ngx_http_upstream_get_ip_hash_peer;
      psVar1 = r->connection->sockaddr;
      if (psVar1->sa_family == 10) {
        puVar4 = (u_char *)(psVar1->sa_data + 6);
        uVar5 = 0x10;
      }
      else {
        uVar5 = 3;
        if (psVar1->sa_family == 2) {
          puVar4 = (u_char *)(psVar1->sa_data + 2);
        }
        else {
          puVar4 = ngx_http_upstream_ip_hash_pseudo_addr;
        }
      }
      *(u_char **)((long)pvVar2 + 0x38) = puVar4;
      *(undefined1 *)((long)pvVar2 + 0x30) = uVar5;
      *(undefined8 *)((long)pvVar2 + 0x28) = 0x59;
      *(undefined1 *)((long)pvVar2 + 0x40) = 0;
      *(code **)((long)pvVar2 + 0x48) = ngx_http_upstream_get_round_robin_peer;
      nVar6 = 0;
    }
  }
  return nVar6;
}

Assistant:

static ngx_int_t
ngx_http_upstream_init_ip_hash_peer(ngx_http_request_t *r,
    ngx_http_upstream_srv_conf_t *us)
{
    struct sockaddr_in                     *sin;
#if (NGX_HAVE_INET6)
    struct sockaddr_in6                    *sin6;
#endif
    ngx_http_upstream_ip_hash_peer_data_t  *iphp;

    iphp = ngx_palloc(r->pool, sizeof(ngx_http_upstream_ip_hash_peer_data_t));
    if (iphp == NULL) {
        return NGX_ERROR;
    }

    r->upstream->peer.data = &iphp->rrp;

    if (ngx_http_upstream_init_round_robin_peer(r, us) != NGX_OK) {
        return NGX_ERROR;
    }

    r->upstream->peer.get = ngx_http_upstream_get_ip_hash_peer;

    switch (r->connection->sockaddr->sa_family) {

    case AF_INET:
        sin = (struct sockaddr_in *) r->connection->sockaddr;
        iphp->addr = (u_char *) &sin->sin_addr.s_addr;
        iphp->addrlen = 3;
        break;

#if (NGX_HAVE_INET6)
    case AF_INET6:
        sin6 = (struct sockaddr_in6 *) r->connection->sockaddr;
        iphp->addr = (u_char *) &sin6->sin6_addr.s6_addr;
        iphp->addrlen = 16;
        break;
#endif

    default:
        iphp->addr = ngx_http_upstream_ip_hash_pseudo_addr;
        iphp->addrlen = 3;
    }

    iphp->hash = 89;
    iphp->tries = 0;
    iphp->get_rr_peer = ngx_http_upstream_get_round_robin_peer;

    return NGX_OK;
}